

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.cpp
# Opt level: O0

size_t Jupiter_base64decode(char *in,uchar *out)

{
  byte bVar1;
  ulong uVar2;
  uchar *puVar3;
  ulong uStack_30;
  uchar c;
  size_t buf;
  uchar *outOrig;
  uchar *out_local;
  char *in_local;
  
  uStack_30 = 1;
  outOrig = out;
  out_local = (uchar *)in;
  while (*out_local != '\0') {
    puVar3 = out_local + 1;
    bVar1 = "BBBBBBBBB@BBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBB>BBB?456789:;<=BBBABBB"[(char)*out_local];
    out_local = puVar3;
    if (bVar1 != 0x40) {
      if (bVar1 == 0x41) break;
      if (bVar1 == 0x42) {
        return 0;
      }
      uVar2 = uStack_30 << 6;
      uStack_30 = uVar2 | bVar1;
      if ((uVar2 & 0x1000000) != 0) {
        *outOrig = (uchar)(uVar2 >> 0x10);
        puVar3 = outOrig + 2;
        outOrig[1] = (uchar)(uVar2 >> 8);
        outOrig = outOrig + 3;
        *puVar3 = (uchar)uStack_30;
        uStack_30 = 1;
      }
    }
  }
  if ((uStack_30 & 0x40000) == 0) {
    if ((uStack_30 & 0x1000) != 0) {
      *outOrig = (uchar)(uStack_30 >> 4);
      outOrig = outOrig + 1;
    }
  }
  else {
    *outOrig = (uchar)(uStack_30 >> 10);
    outOrig[1] = (uchar)(uStack_30 >> 2);
    outOrig = outOrig + 2;
  }
  return (size_t)(outOrig + -(long)out);
}

Assistant:

size_t Jupiter_base64decode(const char *in, unsigned char *out)
{
	unsigned char *outOrig = out;
	size_t buf = 1;

	while (*in != 0)
	{
		unsigned char c = Jupiter_base64DecodeTable[*in++];

		switch (c)
		{
		case 66:
			/* invalid input */
			return 0;
		case 65:
			/* pad character, end of data */
			goto endLoop;
		case 64:
			break;
		default:
			buf = buf << 6 | c;

			/* If the buffer is full, split it into bytes */
			if (buf & 0x1000000)
			{
				*out++ = (unsigned char)(buf >> 16);
				*out++ = (unsigned char)(buf >> 8);
				*out++ = (unsigned char)buf;
				buf = 1;
			}
			break;
		}
	}
endLoop:

	if (buf & 0x40000)
	{
		*out++ = (unsigned char)(buf >> 10);
		*out++ = (unsigned char)(buf >> 2);
	}
	else if (buf & 0x1000) *out++ = (unsigned char)(buf >> 4);

	return out - outOrig;
}